

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall
Imf_3_4::Array2D<Imf_3_4::PreviewRgba>::resizeErase
          (Array2D<Imf_3_4::PreviewRgba> *this,long sizeX,long sizeY)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = sizeY * sizeX;
  pvVar1 = operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
  if (uVar3 != 0) {
    lVar2 = 0;
    do {
      *(undefined4 *)((long)pvVar1 + lVar2) = 0xff000000;
      lVar2 = lVar2 + 4;
    } while (uVar3 * 4 - lVar2 != 0);
  }
  if (*(void **)(this + 0x10) != (void *)0x0) {
    operator_delete__(*(void **)(this + 0x10));
  }
  *(long *)this = sizeX;
  *(long *)(this + 8) = sizeY;
  *(void **)(this + 0x10) = pvVar1;
  return;
}

Assistant:

inline void
Array2D<T>::resizeErase (long sizeX, long sizeY)
{
    T* tmp = new T[sizeX * sizeY];
    delete[] _data;
    _sizeX = sizeX;
    _sizeY = sizeY;
    _data  = tmp;
}